

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.h
# Opt level: O0

int __thiscall gmath::DVector<double>::init(DVector<double> *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  DVector<double> *pDVar4;
  int i;
  uint local_10;
  
  if ((this->v != (double *)0x0) && (this->v != (double *)0x0)) {
    operator_delete__(this->v);
  }
  this->n = (int)ctx;
  this->v = (double *)0x0;
  pDVar4 = this;
  if (0 < this->n) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->n;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    this->v = pdVar3;
    for (local_10 = 0; pDVar4 = (DVector<double> *)(ulong)local_10, (int)local_10 < this->n;
        local_10 = local_10 + 1) {
      this->v[(int)local_10] = 0.0;
    }
  }
  return (int)pDVar4;
}

Assistant:

void init(int len)
    {
      if (v != 0)
      {
        delete [] v;
      }

      n=len;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }
      }
    }